

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::predict_or_learn<true>(csoaa *c,single_learner *base,example *ec)

{
  wclass *pwVar1;
  uint32_t *puVar2;
  size_t sVar3;
  wclass **ppwVar4;
  float *pfVar5;
  long in_RDX;
  uint *in_RDI;
  float margin;
  float val;
  size_t i_1;
  float second_best_cost;
  uint64_t second_best;
  uint32_t i;
  float temp;
  wclass *cl;
  wclass *__end3;
  wclass *__begin3;
  v_array<COST_SENSITIVE::wclass> *__range3;
  size_t pt_start;
  float score;
  uint32_t prediction;
  label ld;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float *in_stack_ffffffffffffff50;
  uint32_t *prediction_00;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  example *in_stack_ffffffffffffff68;
  ulong i_00;
  ulong uVar6;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float fVar7;
  uint local_80;
  wclass *local_68;
  v_array<COST_SENSITIVE::wclass> local_38;
  long local_18;
  uint *local_8;
  
  local_38._begin = *(wclass **)(in_RDX + 0x6828);
  local_38._end = *(wclass **)(in_RDX + 0x6830);
  local_38.end_array = *(wclass **)(in_RDX + 0x6838);
  local_38.erase_count = *(size_t *)(in_RDX + 0x6840);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (*(long *)(in_RDX + 0x68c0) == 0) {
    puVar2 = (uint32_t *)0x0;
  }
  else {
    puVar2 = (uint32_t *)features::size((features *)0x3913df);
  }
  *(undefined8 *)(local_18 + 0x6828) = 0;
  *(undefined4 *)(local_18 + 0x6830) = 0;
  prediction_00 = puVar2;
  sVar3 = v_array<COST_SENSITIVE::wclass>::size(&local_38);
  if (sVar3 == 0) {
    for (local_80 = 1; local_80 <= *local_8; local_80 = local_80 + 1) {
      inner_loop<false>((single_learner *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68,(uint32_t)in_stack_ffffffffffffff64,
                        in_stack_ffffffffffffff60,prediction_00,in_stack_ffffffffffffff50,
                        (float *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
  }
  else {
    ppwVar4 = v_array<COST_SENSITIVE::wclass>::begin(&local_38);
    local_68 = *ppwVar4;
    ppwVar4 = v_array<COST_SENSITIVE::wclass>::end(&local_38);
    pwVar1 = *ppwVar4;
    for (; local_68 != pwVar1; local_68 = local_68 + 1) {
      inner_loop<true>((single_learner *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68,(uint32_t)in_stack_ffffffffffffff64,
                       in_stack_ffffffffffffff60,prediction_00,in_stack_ffffffffffffff50,
                       (float *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    *(undefined4 *)(local_18 + 0x68a8) = 0x7f7fffff;
  }
  if (*(long *)(local_18 + 0x68c0) != 0) {
    fVar7 = 3.4028235e+38;
    i_00 = 0;
    while (uVar6 = i_00, sVar3 = features::size((features *)0x39159c), i_00 < sVar3 - (long)puVar2)
    {
      pfVar5 = v_array<float>::operator[]
                         (*(v_array<float> **)(local_18 + 0x68c0),(long)puVar2 + uVar6);
      in_stack_ffffffffffffff64 = *pfVar5;
      if ((*(float *)(local_18 + 0x68a8) <= in_stack_ffffffffffffff64 &&
           in_stack_ffffffffffffff64 != *(float *)(local_18 + 0x68a8)) &&
         (in_stack_ffffffffffffff64 < fVar7)) {
        fVar7 = in_stack_ffffffffffffff64;
        v_array<unsigned_long>::operator[]
                  ((v_array<unsigned_long> *)(*(long *)(local_18 + 0x68c0) + 0x20),
                   (long)puVar2 + uVar6);
      }
      i_00 = uVar6 + 1;
    }
    if (3.4028235e+38 <= fVar7) {
      add_passthrough_feature_magic
                ((example *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (uint64_t)prediction_00,i_00,in_stack_ffffffffffffff4c);
    }
    else {
      fVar7 = fVar7 - *(float *)(local_18 + 0x68a8);
      add_passthrough_feature_magic
                ((example *)CONCAT44(in_stack_ffffffffffffff64,fVar7),(uint64_t)prediction_00,i_00,
                 in_stack_ffffffffffffff4c);
      add_passthrough_feature_magic
                ((example *)CONCAT44(in_stack_ffffffffffffff64,fVar7),(uint64_t)prediction_00,i_00,
                 in_stack_ffffffffffffff4c);
    }
  }
  *(undefined4 *)(local_18 + 0x6850) = 1;
  *(wclass **)(local_18 + 0x6828) = local_38._begin;
  *(wclass **)(local_18 + 0x6830) = local_38._end;
  *(wclass **)(local_18 + 0x6838) = local_38.end_array;
  *(size_t *)(local_18 + 0x6840) = local_38.erase_count;
  return;
}

Assistant:

void predict_or_learn(csoaa& c, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;
  uint32_t prediction = 1;
  float score = FLT_MAX;
  size_t pt_start = ec.passthrough ? ec.passthrough->size() : 0;
  ec.l.simple = {0., 0., 0.};
  if (ld.costs.size() > 0)
  {
    for (auto& cl : ld.costs)
      inner_loop<is_learn>(base, ec, cl.class_index, cl.x, prediction, score, cl.partial_prediction);
    ec.partial_prediction = score;
  }
  else if (DO_MULTIPREDICT && !is_learn)
  {
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    base.multipredict(ec, 0, c.num_classes, c.pred, false);
    for (uint32_t i = 1; i <= c.num_classes; i++)
    {
      add_passthrough_feature(ec, i, c.pred[i - 1].scalar);
      if (c.pred[i - 1].scalar < c.pred[prediction - 1].scalar)
        prediction = i;
    }
    ec.partial_prediction = c.pred[prediction - 1].scalar;
  }
  else
  {
    float temp;
    for (uint32_t i = 1; i <= c.num_classes; i++) inner_loop<false>(base, ec, i, FLT_MAX, prediction, score, temp);
  }
  if (ec.passthrough)
  {
    uint64_t second_best = 0;
    float second_best_cost = FLT_MAX;
    for (size_t i = 0; i < ec.passthrough->size() - pt_start; i++)
    {
      float val = ec.passthrough->values[pt_start + i];
      if ((val > ec.partial_prediction) && (val < second_best_cost))
      {
        second_best_cost = val;
        second_best = ec.passthrough->indicies[pt_start + i];
      }
    }
    if (second_best_cost < FLT_MAX)
    {
      float margin = second_best_cost - ec.partial_prediction;
      add_passthrough_feature(ec, constant * 2, margin);
      add_passthrough_feature(ec, constant * 2 + 1 + second_best, 1.);
    }
    else
      add_passthrough_feature(ec, constant * 3, 1.);
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}